

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O2

bool baryonyx::itm::
     is_valid_constraint<baryonyx::itm::solver_inequalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,false>,baryonyx::bit_array>
               (solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>
                *slv,int k,bit_array *x)

{
  bound_factor *pbVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  unique_ptr<int[],_std::default_delete<int[]>_> local_40;
  _Head_base<0UL,_int_*,_false> local_38;
  
  sparse_matrix<int>::row((sparse_matrix<int> *)&local_40,(int)slv + 0x10);
  iVar5 = 0;
  for (; (__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)local_38._M_head_impl !=
         (__uniq_ptr_impl<int,_std::default_delete<int[]>_>)
         local_40._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
         super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
         super__Head_base<0UL,_int_*,_false>._M_head_impl;
      local_38._M_head_impl = local_38._M_head_impl + 8) {
    iVar3 = value_bit_array<-1,_1>::get(&slv->A,*local_38._M_head_impl);
    iVar4 = bit_array::operator[](x,*(local_38._M_head_impl + 4));
    iVar5 = iVar5 + iVar4 * iVar3;
  }
  pbVar1 = (slv->b)._M_t.
           super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::bound_factor,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::bound_factor[]>_>
           ._M_t.
           super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::bound_factor[]>_>
           .
           super__Head_base<0UL,_baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::bound_factor_*,_false>
           ._M_head_impl;
  if (iVar5 < pbVar1[k].min) {
    bVar2 = false;
  }
  else {
    bVar2 = iVar5 <= pbVar1[k].max;
  }
  return bVar2;
}

Assistant:

bool
is_valid_constraint(const Solver& slv, int k, const Xtype& x)
{
    typename sparse_matrix<int>::const_row_iterator it, et;

    std::tie(it, et) = slv.ap.row(k);
    int v = 0;

    for (; it != et; ++it)
        v += slv.factor(it->value) * x[it->column];

    return slv.bound_min(k) <= v && v <= slv.bound_max(k);
}